

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O0

void __thiscall
HEkkDualRHS::chooseMultiHyperGraphPart
          (HEkkDualRHS *this,HighsInt *chIndex,HighsInt *chCount,HighsInt chLimit)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  size_type __n;
  int in_ECX;
  vector<double,_std::allocator<double>_> *this_00;
  HighsInt *in_RDX;
  HEkkDualRHS *in_RSI;
  long *in_RDI;
  double dVar5;
  HighsInt i_3;
  HighsInt count_1;
  double myWeight_1;
  double myInfeas_1;
  HighsInt iPart_1;
  HighsInt iRow_1;
  HighsInt i_2;
  HighsInt end_1;
  HighsInt start_1;
  HighsInt section_1;
  vector<int,_std::allocator<int>_> bestIndex_1;
  vector<double,_std::allocator<double>_> bestMerit_1;
  HighsInt randomStart_1;
  HighsInt i_1;
  HighsInt count;
  double myWeight;
  double myInfeas;
  HighsInt iPart;
  HighsInt iRow;
  HighsInt end;
  HighsInt start;
  HighsInt section;
  vector<int,_std::allocator<int>_> bestIndex;
  vector<double,_std::allocator<double>_> bestMerit;
  HighsInt randomStart;
  HighsInt numRow;
  vector<double,_std::allocator<double>_> *edge_weight;
  HighsInt i;
  undefined8 in_stack_fffffffffffffe50;
  HighsInt HVar6;
  HighsInt in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  int iVar7;
  HighsInt in_stack_fffffffffffffe60;
  HighsInt in_stack_fffffffffffffe64;
  size_type in_stack_fffffffffffffe68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  vector<int,_std::allocator<int>_> *this_01;
  HighsInt local_168;
  HighsInt local_164;
  int local_138;
  int local_134;
  int local_118;
  int local_10c;
  undefined1 local_105 [37];
  undefined8 local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  HighsInt local_bc;
  int local_b8;
  int local_b4;
  double local_b0;
  value_type local_a8;
  value_type local_9c;
  HighsInt local_98;
  HighsInt local_94;
  HighsInt local_90;
  int local_8c;
  undefined4 local_84;
  vector<int,_std::allocator<int>_> local_80 [2];
  undefined8 local_50;
  vector<double,_std::allocator<double>_> local_48;
  HighsInt local_30;
  HighsInt local_2c;
  undefined8 in_stack_ffffffffffffffd8;
  HighsInt chLimit_00;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar8;
  
  HVar6 = (HighsInt)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  chLimit_00 = (HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
  if ((int)in_RDI[0xc] == in_ECX) {
    for (iVar8 = 0; iVar8 < in_ECX; iVar8 = iVar8 + 1) {
      *(undefined4 *)((long)&in_RSI->ekk_instance_ + (long)iVar8 * 4) = 0xffffffff;
    }
    *in_RDX = 0;
    this_00 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x2a20);
    if ((int)in_RDI[2] < 0) {
      local_2c = -(int)in_RDI[2];
      local_30 = HighsRandom::integer
                           ((HighsRandom *)
                            CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),HVar6);
      local_50 = 0;
      std::allocator<double>::allocator((allocator<double> *)0x799bf9);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      std::allocator<double>::~allocator((allocator<double> *)0x799c27);
      local_84 = 0xffffffff;
      std::allocator<int>::allocator((allocator<int> *)0x799c51);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      std::allocator<int>::~allocator((allocator<int> *)0x799c7f);
      for (local_8c = 0; local_8c < 2; local_8c = local_8c + 1) {
        if (local_8c == 0) {
          local_164 = local_30;
        }
        else {
          local_164 = 0;
        }
        local_90 = local_164;
        if (local_8c == 0) {
          local_168 = local_2c;
        }
        else {
          local_168 = local_30;
        }
        local_94 = local_168;
        for (local_98 = local_164; local_98 < local_94; local_98 = local_98 + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)local_98
                             );
          if (1e-50 < *pvVar3) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf),(long)local_98);
            local_9c = *pvVar4;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),
                                (long)local_98);
            local_a8 = *pvVar3;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (this_00,(long)local_98);
            local_b0 = *pvVar3;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_48,(long)local_9c);
            if (*pvVar3 * local_b0 < local_a8) {
              dVar5 = local_a8 / local_b0;
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_48,(long)local_9c);
              HVar6 = local_98;
              *pvVar3 = dVar5;
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_80,(long)local_9c);
              *pvVar4 = HVar6;
            }
          }
        }
      }
      local_b4 = 0;
      for (local_b8 = 0; local_b8 < in_ECX; local_b8 = local_b8 + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_80,(long)local_b8);
        if (*pvVar4 != -1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_80,(long)local_b8);
          *(value_type *)((long)&in_RSI->ekk_instance_ + (long)local_b4 * 4) = *pvVar4;
          local_b4 = local_b4 + 1;
        }
      }
      *in_RDX = local_b4;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    }
    else {
      if ((int)in_RDI[2] == 0) {
        HighsSimplexAnalysis::simplexTimerStop
                  ((HighsSimplexAnalysis *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
        return;
      }
      local_bc = HighsRandom::integer
                           ((HighsRandom *)
                            CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),HVar6);
      local_e0 = 0;
      std::allocator<double>::allocator((allocator<double> *)0x799fee);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      std::allocator<double>::~allocator((allocator<double> *)0x79a01c);
      __n = (size_type)in_ECX;
      local_105._1_4_ = 0xffffffff;
      this_01 = (vector<int,_std::allocator<int>_> *)local_105;
      std::allocator<int>::allocator((allocator<int> *)0x79a046);
      std::vector<int,_std::allocator<int>_>::vector
                (this_01,__n,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      std::allocator<int>::~allocator((allocator<int> *)0x79a074);
      for (local_10c = 0; local_10c < 2; local_10c = local_10c + 1) {
        if (local_10c == 0) {
          in_stack_fffffffffffffe60 = (HighsInt)in_RDI[2];
          in_stack_fffffffffffffe64 = local_bc;
          local_118 = local_bc;
          iVar8 = (HighsInt)in_RDI[2];
        }
        else {
          in_stack_fffffffffffffe64 = 0;
          in_stack_fffffffffffffe60 = local_bc;
          local_118 = in_stack_fffffffffffffe64;
          iVar8 = local_bc;
        }
        for (; local_118 < iVar8; local_118 = local_118 + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)local_118);
          iVar7 = *pvVar4;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)iVar7);
          if (1e-50 < *pvVar3) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf),(long)iVar7);
            iVar2 = *pvVar4;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)iVar7)
            ;
            dVar5 = *pvVar3;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar7);
            dVar1 = *pvVar3;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_d8,(long)iVar2)
            ;
            if (*pvVar3 * dVar1 < dVar5) {
              dVar5 = dVar5 / dVar1;
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_d8,(long)iVar2);
              *pvVar3 = dVar5;
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(local_105 + 5),(long)iVar2);
              *pvVar4 = iVar7;
              in_stack_fffffffffffffe5c = iVar7;
            }
          }
        }
      }
      local_134 = 0;
      for (local_138 = 0; local_138 < in_ECX; local_138 = local_138 + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_105 + 5),(long)local_138);
        if (*pvVar4 != -1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_105 + 5),(long)local_138);
          *(value_type *)((long)&in_RSI->ekk_instance_ + (long)local_134 * 4) = *pvVar4;
          local_134 = local_134 + 1;
        }
      }
      *in_RDX = local_134;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    }
    HighsSimplexAnalysis::simplexTimerStop
              ((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
               ,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
  }
  else {
    chooseMultiGlobal(in_RSI,in_RDX,(HighsInt *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                      chLimit_00);
    *(undefined4 *)(in_RDI + 0xe) = 0;
    HighsSimplexAnalysis::simplexTimerStop
              ((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
               ,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
  }
  return;
}

Assistant:

void HEkkDualRHS::chooseMultiHyperGraphPart(HighsInt* chIndex,
                                            HighsInt* chCount,
                                            HighsInt chLimit) {
  analysis->simplexTimerStart(ChuzrDualClock);

  // Force to use partition method, unless doesn't exist
  if (partNum != chLimit) {
    chooseMultiGlobal(chIndex, chCount, chLimit);
    partSwitch = 0;
    analysis->simplexTimerStop(ChuzrDualClock);
    return;
  }

  // Initialise
  for (HighsInt i = 0; i < chLimit; i++) chIndex[i] = -1;
  *chCount = 0;

  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount < 0) {
    // DENSE mode
    const HighsInt numRow = -workCount;
    HighsInt randomStart = ekk_instance_.random_.integer(numRow);
    vector<double> bestMerit(chLimit, 0);
    vector<HighsInt> bestIndex(chLimit, -1);
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? numRow : randomStart;
      for (HighsInt iRow = start; iRow < end; iRow++) {
        if (work_infeasibility[iRow] > kHighsZero) {
          HighsInt iPart = workPartition[iRow];
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          if (bestMerit[iPart] * myWeight < myInfeas) {
            bestMerit[iPart] = myInfeas / myWeight;
            bestIndex[iPart] = iRow;
          }
        }
      }
    }
    HighsInt count = 0;
    for (HighsInt i = 0; i < chLimit; i++) {
      if (bestIndex[i] != -1) {
        chIndex[count++] = bestIndex[i];
      }
    }
    *chCount = count;
  } else {
    // SPARSE mode
    if (workCount == 0) {
      analysis->simplexTimerStop(ChuzrDualClock);
      return;
    }

    HighsInt randomStart = ekk_instance_.random_.integer(workCount);
    vector<double> bestMerit(chLimit, 0);
    vector<HighsInt> bestIndex(chLimit, -1);
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? workCount : randomStart;
      for (HighsInt i = start; i < end; i++) {
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > kHighsZero) {
          HighsInt iPart = workPartition[iRow];
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          if (bestMerit[iPart] * myWeight < myInfeas) {
            bestMerit[iPart] = myInfeas / myWeight;
            bestIndex[iPart] = iRow;
          }
        }
      }
    }
    HighsInt count = 0;
    for (HighsInt i = 0; i < chLimit; i++) {
      if (bestIndex[i] != -1) {
        chIndex[count++] = bestIndex[i];
      }
    }
    *chCount = count;
  }

  analysis->simplexTimerStop(ChuzrDualClock);
}